

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void glslang::ModifyFlatDecoration(char *name,bool flat,TSymbolTable *symbolTable)

{
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  long lVar3;
  TString local_38;
  
  local_38._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_38,
             "gl_SubGroupSizeARB","");
  pTVar2 = TSymbolTable::find((TSymbolTable *)name,&local_38,(bool *)0x0,(bool *)0x0,(int *)0x0);
  if (pTVar2 != (TSymbol *)0x0) {
    iVar1 = (*pTVar2->_vptr_TSymbol[0xd])(pTVar2);
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                      ((long *)CONCAT44(extraout_var,iVar1));
    *(byte *)(lVar3 + 0xb) = *(byte *)(lVar3 + 0xb) | 0x80;
  }
  return;
}

Assistant:

static void ModifyFlatDecoration(const char* name, bool flat, TSymbolTable& symbolTable)
{
    TSymbol* symbol = symbolTable.find(name);
    if (symbol == nullptr)
        return;

    TQualifier& symQualifier = symbol->getWritableType().getQualifier();
    symQualifier.flat = flat;
}